

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeReadIOCallback.cpp
# Opt level: O2

void __thiscall libebml::SafeReadIOCallback::Skip(SafeReadIOCallback *this,size_t Count)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EndOfStreamX *this_00;
  size_t MissingBytes;
  
  iVar1 = (*this->mIO->_vptr_IOCallback[5])();
  (*this->mIO->_vptr_IOCallback[3])(this->mIO,Count,1);
  iVar2 = (*this->mIO->_vptr_IOCallback[5])();
  MissingBytes = (CONCAT44(extraout_var,iVar1) + Count) - CONCAT44(extraout_var_00,iVar2);
  if (MissingBytes == 0) {
    return;
  }
  this_00 = (EndOfStreamX *)__cxa_allocate_exception(8);
  EndOfStreamX::EndOfStreamX(this_00,MissingBytes);
  __cxa_throw(this_00,&EndOfStreamX::typeinfo,0);
}

Assistant:

void
SafeReadIOCallback::Skip(size_t Count) {
  int64 PrevPosition     = mIO->getFilePointer();
  int64 ExpectedPosition = PrevPosition + Count;
  mIO->setFilePointer(Count, seek_current);
  int64 ActualPosition   = mIO->getFilePointer();

  if (ActualPosition != ExpectedPosition)
    throw SafeReadIOCallback::EndOfStreamX(ExpectedPosition - ActualPosition);
}